

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  uchar uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t __size;
  undefined1 auVar9 [16];
  size_t sVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int *__s;
  int *__s_00;
  unsigned_short *puVar18;
  unsigned_short *puVar19;
  int *__s_01;
  unsigned_short *puVar20;
  uchar *puVar21;
  uchar *puVar22;
  uint *puVar23;
  undefined1 (*frequencies) [16];
  undefined1 (*frequencies_00) [16];
  unsigned_short uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  size_t sVar29;
  ulong uVar30;
  byte bVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  ulong uVar35;
  size_t sVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar75;
  int iVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar88;
  int iVar90;
  int iVar91;
  undefined1 auVar89 [16];
  int iVar92;
  ucvector v;
  size_t bp;
  uivector bitlen_lld_e;
  HuffmanTree tree_ll;
  uivector bitlen_lld;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  uivector local_a8;
  uivector lz77_encoded;
  Hash local_68;
  ulong local_38;
  
  v.data = *out;
  v.size = *outsize;
  bp = 0;
  uVar17 = settings->btype;
  uVar14 = 0x3d;
  if (uVar17 < 3) {
    sVar36 = insize;
    v.allocsize = v.size;
    if (uVar17 != 1) {
      if (uVar17 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar14 = 0;
        }
        else {
          uVar26 = (insize + 0xfffe) / 0xffff;
          uVar38 = 0;
          uVar35 = 0;
          do {
            sVar36 = v.size;
            uVar32 = v.size + 1;
            puVar21 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar32) {
              uVar25 = uVar32 * 3 >> 1;
              if (v.allocsize * 2 < uVar32) {
                uVar25 = uVar32;
              }
              puVar21 = (uchar *)realloc(v.data,uVar25);
              if (puVar21 != (uchar *)0x0) goto LAB_0010d345;
            }
            else {
LAB_0010d345:
              v.allocsize = uVar25;
              v.data = puVar21;
              v.data[sVar36] = uVar38 == uVar26 - 1;
              v.size = uVar32;
            }
            sVar36 = v.size;
            iVar80 = (int)uVar35;
            iVar75 = (int)insize - iVar80;
            if (0xfffe < insize - uVar35) {
              iVar75 = 0xffff;
            }
            uVar32 = v.size + 1;
            puVar21 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar32) {
              uVar25 = uVar32 * 3 >> 1;
              if (v.allocsize * 2 < uVar32) {
                uVar25 = uVar32;
              }
              puVar21 = (uchar *)realloc(v.data,uVar25);
              if (puVar21 != (uchar *)0x0) goto LAB_0010d3bd;
            }
            else {
LAB_0010d3bd:
              v.allocsize = uVar25;
              v.data = puVar21;
              v.data[sVar36] = (uchar)iVar75;
              v.size = uVar32;
            }
            sVar36 = v.size;
            uVar32 = v.size + 1;
            puVar21 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar32) {
              uVar25 = uVar32 * 3 >> 1;
              if (v.allocsize * 2 < uVar32) {
                uVar25 = uVar32;
              }
              puVar21 = (uchar *)realloc(v.data,uVar25);
              if (puVar21 != (uchar *)0x0) goto LAB_0010d416;
            }
            else {
LAB_0010d416:
              v.allocsize = uVar25;
              v.data = puVar21;
              v.data[sVar36] = (uchar)((uint)iVar75 >> 8);
              v.size = uVar32;
            }
            sVar36 = v.size;
            uVar32 = v.size + 1;
            puVar21 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar32) {
              uVar25 = uVar32 * 3 >> 1;
              if (v.allocsize * 2 < uVar32) {
                uVar25 = uVar32;
              }
              puVar21 = (uchar *)realloc(v.data,uVar25);
              if (puVar21 != (uchar *)0x0) goto LAB_0010d477;
            }
            else {
LAB_0010d477:
              v.allocsize = uVar25;
              v.data = puVar21;
              v.data[sVar36] = (uchar)(0xffff - iVar75);
              v.size = uVar32;
            }
            sVar36 = v.size;
            uVar32 = v.size + 1;
            puVar21 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar32) {
              uVar25 = uVar32 * 3 >> 1;
              if (v.allocsize * 2 < uVar32) {
                uVar25 = uVar32;
              }
              puVar21 = (uchar *)realloc(v.data,uVar25);
              if (puVar21 != (uchar *)0x0) goto LAB_0010d4cf;
            }
            else {
LAB_0010d4cf:
              v.allocsize = uVar25;
              v.data = puVar21;
              v.data[sVar36] = (uchar)((uint)(0xffff - iVar75) >> 8);
              v.size = uVar32;
            }
            if (uVar35 < insize) {
              uVar25 = 0;
              do {
                sVar36 = v.size;
                uVar2 = in[uVar35];
                uVar32 = v.size + 1;
                puVar21 = v.data;
                uVar35 = v.allocsize;
                if (v.allocsize < uVar32) {
                  uVar35 = uVar32 * 3 >> 1;
                  if (v.allocsize * 2 < uVar32) {
                    uVar35 = uVar32;
                  }
                  puVar21 = (uchar *)realloc(v.data,uVar35);
                  if (puVar21 != (uchar *)0x0) goto LAB_0010d53b;
                }
                else {
LAB_0010d53b:
                  v.allocsize = uVar35;
                  v.data = puVar21;
                  v.data[sVar36] = uVar2;
                  v.size = uVar32;
                }
                uVar32 = uVar25 + 1;
              } while ((uVar25 < 0xfffe) &&
                      (uVar35 = (ulong)((int)uVar25 + iVar80 + 1), uVar25 = uVar32, uVar35 < insize)
                      );
              uVar35 = (ulong)(uint)(iVar80 + (int)uVar32);
            }
            uVar38 = uVar38 + 1;
          } while (uVar38 != uVar26);
          uVar14 = 0;
        }
        goto LAB_0010e609;
      }
      uVar26 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar26 = insize >> 3;
      }
      if (0x3fff7 < uVar26) {
        uVar26 = 0x3fff8;
      }
      sVar36 = uVar26 + 8;
    }
    uVar26 = 1;
    if (!CARRY8(insize - 1,sVar36)) {
      uVar26 = ((insize - 1) + sVar36) / sVar36;
    }
    uVar35 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    local_68.head = __s;
    __s_00 = (int *)malloc(uVar35 * 4);
    __size = uVar35 * 2;
    local_68.val = __s_00;
    puVar18 = (unsigned_short *)malloc(__size);
    local_68.chain = puVar18;
    puVar19 = (unsigned_short *)malloc(__size);
    local_68.zeros = puVar19;
    __s_01 = (int *)malloc(0x40c);
    local_68.headz = __s_01;
    puVar20 = (unsigned_short *)malloc(__size);
    uVar14 = 0x53;
    uVar17 = 0x53;
    local_68.chainz = puVar20;
    if (__s_00 == (int *)0x0) {
      bVar43 = false;
      uVar14 = uVar17;
    }
    else {
      bVar43 = false;
      if ((__s != (int *)0x0) && (puVar18 != (unsigned_short *)0x0)) {
        bVar43 = false;
        if ((puVar19 != (unsigned_short *)0x0) &&
           ((uVar14 = uVar17, bVar43 = false, __s_01 != (int *)0x0 &&
            (puVar20 != (unsigned_short *)0x0)))) {
          memset(__s,0xff,0x40000);
          if (uVar35 == 0) {
            memset(__s_01,0xff,0x40c);
            bVar43 = true;
            uVar14 = 0;
          }
          else {
            memset(__s_00,0xff,uVar35 * 4);
            auVar9 = _DAT_00121060;
            lVar37 = uVar35 - 1;
            auVar89._8_4_ = (int)lVar37;
            auVar89._0_8_ = lVar37;
            auVar89._12_4_ = (int)((ulong)lVar37 >> 0x20);
            uVar38 = 0;
            auVar89 = auVar89 ^ _DAT_00121060;
            auVar57 = _DAT_00122720;
            auVar83 = _DAT_00122730;
            auVar87 = _DAT_00122740;
            auVar61 = _DAT_00122750;
            do {
              auVar48 = auVar61 ^ auVar9;
              iVar88 = auVar89._0_4_;
              iVar75 = -(uint)(iVar88 < auVar48._0_4_);
              iVar90 = auVar89._4_4_;
              auVar49._4_4_ = -(uint)(iVar90 < auVar48._4_4_);
              iVar91 = auVar89._8_4_;
              iVar80 = -(uint)(iVar91 < auVar48._8_4_);
              iVar92 = auVar89._12_4_;
              auVar49._12_4_ = -(uint)(iVar92 < auVar48._12_4_);
              auVar68._4_4_ = iVar75;
              auVar68._0_4_ = iVar75;
              auVar68._8_4_ = iVar80;
              auVar68._12_4_ = iVar80;
              auVar81 = pshuflw(in_XMM8,auVar68,0xe8);
              auVar51._4_4_ = -(uint)(auVar48._4_4_ == iVar90);
              auVar51._12_4_ = -(uint)(auVar48._12_4_ == iVar92);
              auVar51._0_4_ = auVar51._4_4_;
              auVar51._8_4_ = auVar51._12_4_;
              auVar86 = pshuflw(in_XMM9,auVar51,0xe8);
              auVar49._0_4_ = auVar49._4_4_;
              auVar49._8_4_ = auVar49._12_4_;
              auVar82 = pshuflw(auVar81,auVar49,0xe8);
              auVar48._8_4_ = 0xffffffff;
              auVar48._0_8_ = 0xffffffffffffffff;
              auVar48._12_4_ = 0xffffffff;
              auVar48 = (auVar82 | auVar86 & auVar81) ^ auVar48;
              auVar48 = packssdw(auVar48,auVar48);
              uVar24 = (unsigned_short)uVar38;
              if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar18[uVar38] = uVar24;
              }
              auVar49 = auVar51 & auVar68 | auVar49;
              auVar48 = packssdw(auVar49,auVar49);
              auVar82._8_4_ = 0xffffffff;
              auVar82._0_8_ = 0xffffffffffffffff;
              auVar82._12_4_ = 0xffffffff;
              auVar48 = packssdw(auVar48 ^ auVar82,auVar48 ^ auVar82);
              if ((auVar48._0_4_ >> 0x10 & 1) != 0) {
                puVar18[uVar38 + 1] = uVar24 + 1;
              }
              auVar48 = auVar87 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar48._0_4_);
              auVar76._4_4_ = -(uint)(iVar90 < auVar48._4_4_);
              iVar80 = -(uint)(iVar91 < auVar48._8_4_);
              auVar76._12_4_ = -(uint)(iVar92 < auVar48._12_4_);
              auVar50._4_4_ = iVar75;
              auVar50._0_4_ = iVar75;
              auVar50._8_4_ = iVar80;
              auVar50._12_4_ = iVar80;
              auVar67._4_4_ = -(uint)(auVar48._4_4_ == iVar90);
              auVar67._12_4_ = -(uint)(auVar48._12_4_ == iVar92);
              auVar67._0_4_ = auVar67._4_4_;
              auVar67._8_4_ = auVar67._12_4_;
              auVar76._0_4_ = auVar76._4_4_;
              auVar76._8_4_ = auVar76._12_4_;
              auVar48 = auVar67 & auVar50 | auVar76;
              auVar48 = packssdw(auVar48,auVar48);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar48 = packssdw(auVar48 ^ auVar3,auVar48 ^ auVar3);
              if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar18[uVar38 + 2] = uVar24 + 2;
              }
              auVar51 = pshufhw(auVar50,auVar50,0x84);
              auVar68 = pshufhw(auVar67,auVar67,0x84);
              auVar49 = pshufhw(auVar51,auVar76,0x84);
              auVar52._8_4_ = 0xffffffff;
              auVar52._0_8_ = 0xffffffffffffffff;
              auVar52._12_4_ = 0xffffffff;
              auVar52 = (auVar49 | auVar68 & auVar51) ^ auVar52;
              auVar51 = packssdw(auVar52,auVar52);
              if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar18[uVar38 + 3] = uVar24 + 3;
              }
              auVar51 = auVar83 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar51._0_4_);
              auVar54._4_4_ = -(uint)(iVar90 < auVar51._4_4_);
              iVar80 = -(uint)(iVar91 < auVar51._8_4_);
              auVar54._12_4_ = -(uint)(iVar92 < auVar51._12_4_);
              auVar69._4_4_ = iVar75;
              auVar69._0_4_ = iVar75;
              auVar69._8_4_ = iVar80;
              auVar69._12_4_ = iVar80;
              auVar48 = pshuflw(auVar48,auVar69,0xe8);
              auVar53._4_4_ = -(uint)(auVar51._4_4_ == iVar90);
              auVar53._12_4_ = -(uint)(auVar51._12_4_ == iVar92);
              auVar53._0_4_ = auVar53._4_4_;
              auVar53._8_4_ = auVar53._12_4_;
              in_XMM9 = pshuflw(auVar86 & auVar81,auVar53,0xe8);
              in_XMM9 = in_XMM9 & auVar48;
              auVar54._0_4_ = auVar54._4_4_;
              auVar54._8_4_ = auVar54._12_4_;
              auVar48 = pshuflw(auVar48,auVar54,0xe8);
              auVar81._8_4_ = 0xffffffff;
              auVar81._0_8_ = 0xffffffffffffffff;
              auVar81._12_4_ = 0xffffffff;
              auVar81 = (auVar48 | in_XMM9) ^ auVar81;
              auVar48 = packssdw(auVar81,auVar81);
              if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar18[uVar38 + 4] = uVar24 + 4;
              }
              auVar54 = auVar53 & auVar69 | auVar54;
              auVar48 = packssdw(auVar54,auVar54);
              auVar86._8_4_ = 0xffffffff;
              auVar86._0_8_ = 0xffffffffffffffff;
              auVar86._12_4_ = 0xffffffff;
              auVar48 = packssdw(auVar48 ^ auVar86,auVar48 ^ auVar86);
              if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar18[uVar38 + 5] = uVar24 + 5;
              }
              auVar48 = auVar57 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar48._0_4_);
              auVar77._4_4_ = -(uint)(iVar90 < auVar48._4_4_);
              iVar80 = -(uint)(iVar91 < auVar48._8_4_);
              auVar77._12_4_ = -(uint)(iVar92 < auVar48._12_4_);
              auVar55._4_4_ = iVar75;
              auVar55._0_4_ = iVar75;
              auVar55._8_4_ = iVar80;
              auVar55._12_4_ = iVar80;
              auVar70._4_4_ = -(uint)(auVar48._4_4_ == iVar90);
              auVar70._12_4_ = -(uint)(auVar48._12_4_ == iVar92);
              auVar70._0_4_ = auVar70._4_4_;
              auVar70._8_4_ = auVar70._12_4_;
              auVar77._0_4_ = auVar77._4_4_;
              auVar77._8_4_ = auVar77._12_4_;
              auVar48 = auVar70 & auVar55 | auVar77;
              auVar48 = packssdw(auVar48,auVar48);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar48 ^ auVar4,auVar48 ^ auVar4);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar18[uVar38 + 6] = uVar24 + 6;
              }
              auVar48 = pshufhw(auVar55,auVar55,0x84);
              auVar49 = pshufhw(auVar70,auVar70,0x84);
              auVar51 = pshufhw(auVar48,auVar77,0x84);
              auVar56._8_4_ = 0xffffffff;
              auVar56._0_8_ = 0xffffffffffffffff;
              auVar56._12_4_ = 0xffffffff;
              auVar56 = (auVar51 | auVar49 & auVar48) ^ auVar56;
              auVar48 = packssdw(auVar56,auVar56);
              if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar18[uVar38 + 7] = uVar24 + 7;
              }
              uVar38 = uVar38 + 8;
              lVar37 = auVar61._8_8_;
              auVar61._0_8_ = auVar61._0_8_ + 8;
              auVar61._8_8_ = lVar37 + 8;
              lVar37 = auVar87._8_8_;
              auVar87._0_8_ = auVar87._0_8_ + 8;
              auVar87._8_8_ = lVar37 + 8;
              lVar37 = auVar83._8_8_;
              auVar83._0_8_ = auVar83._0_8_ + 8;
              auVar83._8_8_ = lVar37 + 8;
              lVar37 = auVar57._8_8_;
              auVar57._0_8_ = auVar57._0_8_ + 8;
              auVar57._8_8_ = lVar37 + 8;
            } while ((uVar35 + 7 & 0xfffffffffffffff8) != uVar38);
            memset(__s_01,0xff,0x40c);
            auVar9 = _DAT_00121060;
            uVar38 = 0;
            auVar44 = _DAT_00122720;
            auVar45 = _DAT_00122730;
            auVar46 = _DAT_00122740;
            auVar47 = _DAT_00122750;
            do {
              auVar57 = auVar47 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar57._0_4_);
              auVar59._4_4_ = -(uint)(iVar90 < auVar57._4_4_);
              iVar80 = -(uint)(iVar91 < auVar57._8_4_);
              auVar59._12_4_ = -(uint)(iVar92 < auVar57._12_4_);
              auVar71._4_4_ = iVar75;
              auVar71._0_4_ = iVar75;
              auVar71._8_4_ = iVar80;
              auVar71._12_4_ = iVar80;
              auVar83 = pshuflw(in_XMM8,auVar71,0xe8);
              auVar58._4_4_ = -(uint)(auVar57._4_4_ == iVar90);
              auVar58._12_4_ = -(uint)(auVar57._12_4_ == iVar92);
              auVar58._0_4_ = auVar58._4_4_;
              auVar58._8_4_ = auVar58._12_4_;
              auVar87 = pshuflw(in_XMM9,auVar58,0xe8);
              auVar59._0_4_ = auVar59._4_4_;
              auVar59._8_4_ = auVar59._12_4_;
              auVar57 = pshuflw(auVar83,auVar59,0xe8);
              auVar84._8_4_ = 0xffffffff;
              auVar84._0_8_ = 0xffffffffffffffff;
              auVar84._12_4_ = 0xffffffff;
              auVar84 = (auVar57 | auVar87 & auVar83) ^ auVar84;
              auVar57 = packssdw(auVar84,auVar84);
              uVar24 = (unsigned_short)uVar38;
              if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar20[uVar38] = uVar24;
              }
              auVar59 = auVar58 & auVar71 | auVar59;
              auVar57 = packssdw(auVar59,auVar59);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar5,auVar57 ^ auVar5);
              if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
                puVar20[uVar38 + 1] = uVar24 + 1;
              }
              auVar57 = auVar46 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar57._0_4_);
              auVar78._4_4_ = -(uint)(iVar90 < auVar57._4_4_);
              iVar80 = -(uint)(iVar91 < auVar57._8_4_);
              auVar78._12_4_ = -(uint)(iVar92 < auVar57._12_4_);
              auVar60._4_4_ = iVar75;
              auVar60._0_4_ = iVar75;
              auVar60._8_4_ = iVar80;
              auVar60._12_4_ = iVar80;
              auVar72._4_4_ = -(uint)(auVar57._4_4_ == iVar90);
              auVar72._12_4_ = -(uint)(auVar57._12_4_ == iVar92);
              auVar72._0_4_ = auVar72._4_4_;
              auVar72._8_4_ = auVar72._12_4_;
              auVar78._0_4_ = auVar78._4_4_;
              auVar78._8_4_ = auVar78._12_4_;
              auVar57 = auVar72 & auVar60 | auVar78;
              auVar57 = packssdw(auVar57,auVar57);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar6,auVar57 ^ auVar6);
              if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar20[uVar38 + 2] = uVar24 + 2;
              }
              auVar61 = pshufhw(auVar60,auVar60,0x84);
              auVar48 = pshufhw(auVar72,auVar72,0x84);
              auVar89 = pshufhw(auVar61,auVar78,0x84);
              auVar62._8_4_ = 0xffffffff;
              auVar62._0_8_ = 0xffffffffffffffff;
              auVar62._12_4_ = 0xffffffff;
              auVar62 = (auVar89 | auVar48 & auVar61) ^ auVar62;
              auVar61 = packssdw(auVar62,auVar62);
              if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar20[uVar38 + 3] = uVar24 + 3;
              }
              auVar61 = auVar45 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar61._0_4_);
              auVar64._4_4_ = -(uint)(iVar90 < auVar61._4_4_);
              iVar80 = -(uint)(iVar91 < auVar61._8_4_);
              auVar64._12_4_ = -(uint)(iVar92 < auVar61._12_4_);
              auVar73._4_4_ = iVar75;
              auVar73._0_4_ = iVar75;
              auVar73._8_4_ = iVar80;
              auVar73._12_4_ = iVar80;
              auVar57 = pshuflw(auVar57,auVar73,0xe8);
              auVar63._4_4_ = -(uint)(auVar61._4_4_ == iVar90);
              auVar63._12_4_ = -(uint)(auVar61._12_4_ == iVar92);
              auVar63._0_4_ = auVar63._4_4_;
              auVar63._8_4_ = auVar63._12_4_;
              in_XMM9 = pshuflw(auVar87 & auVar83,auVar63,0xe8);
              in_XMM9 = in_XMM9 & auVar57;
              auVar64._0_4_ = auVar64._4_4_;
              auVar64._8_4_ = auVar64._12_4_;
              auVar57 = pshuflw(auVar57,auVar64,0xe8);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar57 | in_XMM9) ^ auVar85;
              auVar57 = packssdw(auVar85,auVar85);
              if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar20[uVar38 + 4] = uVar24 + 4;
              }
              auVar64 = auVar63 & auVar73 | auVar64;
              auVar57 = packssdw(auVar64,auVar64);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar57 = packssdw(auVar57 ^ auVar7,auVar57 ^ auVar7);
              if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar20[uVar38 + 5] = uVar24 + 5;
              }
              auVar57 = auVar44 ^ auVar9;
              iVar75 = -(uint)(iVar88 < auVar57._0_4_);
              auVar79._4_4_ = -(uint)(iVar90 < auVar57._4_4_);
              iVar80 = -(uint)(iVar91 < auVar57._8_4_);
              auVar79._12_4_ = -(uint)(iVar92 < auVar57._12_4_);
              auVar65._4_4_ = iVar75;
              auVar65._0_4_ = iVar75;
              auVar65._8_4_ = iVar80;
              auVar65._12_4_ = iVar80;
              auVar74._4_4_ = -(uint)(auVar57._4_4_ == iVar90);
              auVar74._12_4_ = -(uint)(auVar57._12_4_ == iVar92);
              auVar74._0_4_ = auVar74._4_4_;
              auVar74._8_4_ = auVar74._12_4_;
              auVar79._0_4_ = auVar79._4_4_;
              auVar79._8_4_ = auVar79._12_4_;
              auVar57 = auVar74 & auVar65 | auVar79;
              auVar57 = packssdw(auVar57,auVar57);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar57 ^ auVar8,auVar57 ^ auVar8);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar20[uVar38 + 6] = uVar24 + 6;
              }
              auVar57 = pshufhw(auVar65,auVar65,0x84);
              auVar87 = pshufhw(auVar74,auVar74,0x84);
              auVar83 = pshufhw(auVar57,auVar79,0x84);
              auVar66._8_4_ = 0xffffffff;
              auVar66._0_8_ = 0xffffffffffffffff;
              auVar66._12_4_ = 0xffffffff;
              auVar66 = (auVar83 | auVar87 & auVar57) ^ auVar66;
              auVar57 = packssdw(auVar66,auVar66);
              if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar20[uVar38 + 7] = uVar24 + 7;
              }
              uVar38 = uVar38 + 8;
              lVar37 = auVar47._8_8_;
              auVar47._0_8_ = auVar47._0_8_ + 8;
              auVar47._8_8_ = lVar37 + 8;
              lVar37 = auVar46._8_8_;
              auVar46._0_8_ = auVar46._0_8_ + 8;
              auVar46._8_8_ = lVar37 + 8;
              lVar37 = auVar45._8_8_;
              auVar45._0_8_ = auVar45._0_8_ + 8;
              auVar45._8_8_ = lVar37 + 8;
              lVar37 = auVar44._8_8_;
              auVar44._0_8_ = auVar44._0_8_ + 8;
              auVar44._8_8_ = lVar37 + 8;
            } while ((uVar35 + 7 & 0x1fffffff8) != uVar38);
            uVar14 = 0;
            bVar43 = true;
          }
        }
      }
    }
    if (bVar43) {
      if (uVar26 == 0) {
        uVar14 = 0;
      }
      else {
        local_38 = uVar26 - 1;
        lVar37 = 0;
        uVar14 = 0;
        uVar38 = 0;
        uVar35 = sVar36;
        puVar21 = in;
        do {
          uVar25 = uVar35;
          if (insize < uVar35) {
            uVar25 = insize;
          }
          bVar43 = uVar38 == local_38;
          uVar40 = uVar38 * sVar36;
          uVar32 = uVar40 + sVar36;
          if (insize <= uVar40 + sVar36) {
            uVar32 = insize;
          }
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            bitlen_lld.data = (uint *)0x0;
            bitlen_lld.size._0_4_ = 0;
            bitlen_lld.size._4_4_ = 0;
            bitlen_lld.allocsize = 0;
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            local_a8.data = (uint *)0x0;
            local_a8.size = 0;
            local_a8.allocsize = 0;
            if (settings->use_lz77 == 0) {
              uVar17 = uivector_resize(&lz77_encoded,uVar32 - uVar40);
              if (uVar17 != 0) {
                if (uVar40 < uVar32) {
                  lVar41 = 0;
                  do {
                    lz77_encoded.data[lVar41] = (uint)puVar21[lVar41];
                    lVar41 = lVar41 + 1;
                  } while (uVar25 + lVar37 != lVar41);
                }
                goto LAB_0010da6b;
              }
              uVar14 = 0x53;
LAB_0010dc47:
              puVar23 = (uint *)0x0;
              frequencies = (undefined1 (*) [16])0x0;
              frequencies_00 = (undefined1 (*) [16])0x0;
            }
            else {
              uVar14 = encodeLZ77(&lz77_encoded,&local_68,in,uVar40,uVar32,settings->windowsize,
                                  settings->minmatch,settings->nicematch,settings->lazymatching);
              if (uVar14 != 0) goto LAB_0010dc47;
LAB_0010da6b:
              puVar23 = (uint *)malloc(0x478);
              uVar17 = 0x53;
              uVar14 = uVar17;
              if (puVar23 == (uint *)0x0) {
                frequencies = (undefined1 (*) [16])0x0;
                frequencies_00 = (undefined1 (*) [16])0x0;
              }
              else {
                memset(puVar23,0,0x478);
                frequencies = (undefined1 (*) [16])malloc(0x78);
                if (frequencies != (undefined1 (*) [16])0x0) {
                  frequencies[6] = (undefined1  [16])0x0;
                  frequencies[5] = (undefined1  [16])0x0;
                  frequencies[4] = (undefined1  [16])0x0;
                  frequencies[3] = (undefined1  [16])0x0;
                  frequencies[2] = (undefined1  [16])0x0;
                  frequencies[1] = (undefined1  [16])0x0;
                  *frequencies = (undefined1  [16])0x0;
                  *(undefined8 *)frequencies[7] = 0;
                  if (lz77_encoded.size != 0) {
                    sVar27 = 0;
                    do {
                      uVar14 = lz77_encoded.data[sVar27];
                      puVar23[uVar14] = puVar23[uVar14] + 1;
                      if (0x100 < (ulong)uVar14) {
                        *(int *)(*frequencies + (ulong)lz77_encoded.data[sVar27 + 2] * 4) =
                             *(int *)(*frequencies + (ulong)lz77_encoded.data[sVar27 + 2] * 4) + 1;
                        sVar27 = sVar27 + 3;
                      }
                      sVar27 = sVar27 + 1;
                    } while (sVar27 != lz77_encoded.size);
                  }
                  puVar23[0x100] = 1;
                  uVar14 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar23,0x101,0x11e,0xf);
                  if (uVar14 == 0) {
                    uVar14 = HuffmanTree_makeFromFrequencies(&tree_d,(uint *)frequencies,2,0x1e,0xf)
                    ;
                    uVar16 = tree_d.numcodes;
                    puVar11 = tree_ll.lengths;
                    if (uVar14 == 0) {
                      uVar25 = 0x11e;
                      if (tree_ll.numcodes < 0x11e) {
                        uVar25 = (ulong)tree_ll.numcodes;
                      }
                      uVar32 = 0x1e;
                      if (tree_d.numcodes < 0x1e) {
                        uVar32 = (ulong)tree_d.numcodes;
                      }
                      if (tree_ll.numcodes != 0) {
                        uVar40 = 0;
                        do {
                          uVar14 = puVar11[uVar40];
                          uVar15 = uivector_resize(&bitlen_lld,
                                                   CONCAT44(bitlen_lld.size._4_4_,
                                                            (uint)bitlen_lld.size) + 1);
                          if (uVar15 != 0) {
                            bitlen_lld.data
                            [CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size) + -1] = uVar14;
                          }
                          uVar40 = uVar40 + 1;
                        } while (uVar25 != uVar40);
                      }
                      puVar11 = tree_d.lengths;
                      if (uVar16 != 0) {
                        uVar40 = 0;
                        do {
                          uVar14 = puVar11[uVar40];
                          uVar16 = uivector_resize(&bitlen_lld,
                                                   CONCAT44(bitlen_lld.size._4_4_,
                                                            (uint)bitlen_lld.size) + 1);
                          if (uVar16 != 0) {
                            bitlen_lld.data
                            [CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size) + -1] = uVar14;
                          }
                          uVar40 = uVar40 + 1;
                        } while (uVar32 != uVar40);
                      }
                      puVar11 = bitlen_lld.data;
                      uVar40 = (ulong)(uint)bitlen_lld.size;
                      if (uVar40 != 0) {
                        uVar34 = 0;
                        do {
                          uVar39 = uVar34 + 1;
                          uVar30 = 0;
                          if (uVar39 < uVar40) {
                            uVar30 = 0;
                            uVar28 = uVar39;
                            do {
                              if (puVar11[uVar28] != puVar11[uVar34]) break;
                              uVar30 = (ulong)((int)uVar30 + 1);
                              uVar28 = uVar39 + uVar30;
                            } while (uVar28 < uVar40);
                          }
                          uVar14 = puVar11[uVar34];
                          uVar16 = (uint)uVar30;
                          if ((uVar16 < 2) || (uVar14 != 0)) {
                            if (2 < uVar16) {
                              uVar15 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar15 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar14;
                              }
                              uVar39 = uVar30 / 6;
                              if (5 < uVar16) {
                                do {
                                  uVar14 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                  if (uVar14 != 0) {
                                    bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                                  }
                                  uVar14 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                  if (uVar14 != 0) {
                                    bitlen_lld_e.data[bitlen_lld_e.size - 1] = 3;
                                  }
                                  uVar39 = uVar39 - 1;
                                } while (uVar39 != 0);
                              }
                              uVar14 = uVar16 + (int)(uVar30 / 6) * -6;
                              if (uVar14 < 3) {
                                uVar30 = (ulong)(uVar16 - uVar14);
                              }
                              else {
                                uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                if (uVar16 != 0) {
                                  bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                                }
                                uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                if (uVar16 != 0) {
                                  bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar14 - 3;
                                }
                              }
                              goto LAB_0010e13d;
                            }
                            uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar16 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar14;
                            }
                          }
                          else {
                            uVar14 = uVar16 + 1;
                            if (uVar14 < 0xb) {
                              uVar14 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar14 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x11;
                              }
                              uVar14 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar14 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar16 - 2;
                              }
                            }
                            else {
                              if (0x89 < uVar14) {
                                uVar14 = 0x8a;
                              }
                              uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar16 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x12;
                              }
                              uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar16 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar14 - 0xb;
                              }
                              uVar30 = (ulong)(uVar14 - 1);
                            }
LAB_0010e13d:
                            uVar34 = uVar34 + uVar30;
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar40);
                      }
                      frequencies_00 = (undefined1 (*) [16])malloc(0x4c);
                      sVar27 = bitlen_lld_e.size;
                      uVar14 = uVar17;
                      if (frequencies_00 != (undefined1 (*) [16])0x0) {
                        *(undefined1 (*) [16])(frequencies_00[3] + 0xc) = (undefined1  [16])0x0;
                        frequencies_00[3] = (undefined1  [16])0x0;
                        frequencies_00[2] = (undefined1  [16])0x0;
                        frequencies_00[1] = (undefined1  [16])0x0;
                        *frequencies_00 = (undefined1  [16])0x0;
                        if (bitlen_lld_e.size != 0) {
                          sVar29 = 0;
                          do {
                            uVar14 = bitlen_lld_e.data[sVar29];
                            *(int *)(*frequencies_00 + (ulong)uVar14 * 4) =
                                 *(int *)(*frequencies_00 + (ulong)uVar14 * 4) + 1;
                            sVar29 = (sVar29 - ((ulong)uVar14 < 0x10)) + 2;
                          } while (sVar29 != bitlen_lld_e.size);
                        }
                        uVar14 = HuffmanTree_makeFromFrequencies
                                           (&tree_cl,(uint *)frequencies_00,0x13,0x13,7);
                        if (uVar14 == 0) {
                          uVar40 = (ulong)tree_cl.numcodes;
                          uVar16 = uivector_resize(&local_a8,uVar40);
                          uVar14 = uVar17;
                          if (uVar16 != 0) {
                            if (uVar40 != 0) {
                              lVar41 = 0;
                              do {
                                *(uint *)((long)local_a8.data + lVar41) =
                                     tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar41)];
                                lVar41 = lVar41 + 4;
                              } while (uVar40 << 2 != lVar41);
                            }
                            do {
                              uVar17 = local_a8.data[local_a8.size - 1];
                              bVar42 = local_a8.size < 5;
                              if (bVar42 || uVar17 != 0) {
                                uVar14 = 0;
                                goto LAB_0010e2d2;
                              }
                              uVar14 = uivector_resize(&local_a8,local_a8.size - 1);
                            } while (uVar14 != 0);
                            uVar14 = 0x53;
LAB_0010e2d2:
                            sVar10 = bp;
                            sVar29 = v.size;
                            if (bVar42 || uVar17 != 0) {
                              if ((bp & 7) == 0) {
                                sVar33 = v.size + 1;
                                uVar17 = ucvector_reserve(&v,sVar33);
                                if (uVar17 != 0) {
                                  v.data[sVar29] = '\0';
                                  v.size = sVar33;
                                }
                              }
                              sVar29 = v.size;
                              v.data[v.size - 1] = v.data[v.size - 1] | bVar43 << ((byte)sVar10 & 7)
                              ;
                              bp = sVar10 + 1;
                              if ((bp & 7) == 0) {
                                sVar33 = v.size + 1;
                                uVar17 = ucvector_reserve(&v,sVar33);
                                if (uVar17 != 0) {
                                  v.data[sVar29] = '\0';
                                  v.size = sVar33;
                                }
                              }
                              sVar29 = v.size;
                              uVar40 = sVar10 + 2;
                              if ((uVar40 & 7) == 0) {
                                sVar33 = v.size + 1;
                                bp = uVar40;
                                uVar17 = ucvector_reserve(&v,sVar33);
                                if (uVar17 != 0) {
                                  v.data[sVar29] = '\0';
                                  v.size = sVar33;
                                }
                              }
                              puVar11 = local_a8.data;
                              v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << ((byte)uVar40 & 7)
                              ;
                              bp = sVar10 + 3;
                              iVar75 = (int)local_a8.size;
                              uVar34 = (ulong)(iVar75 - 4) + 3;
                              uVar40 = 0;
                              do {
                                uVar39 = uVar40;
                                if (uVar39 == iVar75 - 4) break;
                                uVar30 = uVar34 & 0xffffffff;
                                uVar34 = uVar34 - 1;
                                uVar40 = uVar39 + 1;
                              } while (local_a8.data[uVar30] == 0);
                              iVar80 = (int)(uVar39 + 1);
                              addBitsToStream(&bp,&v,(int)uVar25 - 0x101,5);
                              addBitsToStream(&bp,&v,(int)uVar32 - 1,5);
                              addBitsToStream(&bp,&v,(iVar75 - iVar80) - 3,4);
                              if (iVar75 + 1 != iVar80) {
                                uVar25 = 0;
                                do {
                                  addBitsToStream(&bp,&v,puVar11[uVar25],3);
                                  uVar25 = uVar25 + 1;
                                } while ((uint)(iVar75 - (int)uVar39) != uVar25);
                              }
                              puVar13 = tree_cl.lengths;
                              puVar12 = tree_cl.tree1d;
                              puVar11 = bitlen_lld_e.data;
                              if (sVar27 != 0) {
                                sVar29 = 0;
                                do {
                                  addHuffmanSymbol(&bp,&v,puVar12[puVar11[sVar29]],
                                                   puVar13[puVar11[sVar29]]);
                                  puVar1 = puVar11 + sVar29;
                                  if (*puVar1 - 0x10 < 3) {
                                    lVar41 = sVar29 + 1;
                                    sVar29 = sVar29 + 1;
                                    addBitsToStream(&bp,&v,puVar11[lVar41],
                                                    *(size_t *)
                                                     (&DAT_00123040 + (ulong)(*puVar1 - 0x10) * 8));
                                  }
                                  sVar29 = sVar29 + 1;
                                } while (sVar29 != sVar27);
                              }
                              writeLZ77data(&bp,&v,&lz77_encoded,&tree_ll,&tree_d);
                              if (tree_ll.lengths[0x100] == 0) {
                                uVar14 = 0x40;
                              }
                              else {
                                addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]
                                                );
                                uVar14 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      frequencies_00 = (undefined1 (*) [16])0x0;
                    }
                    goto LAB_0010dc64;
                  }
                }
                frequencies_00 = (undefined1 (*) [16])0x0;
              }
            }
LAB_0010dc64:
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
            free(tree_cl.tree2d);
            free(tree_cl.tree1d);
            free(tree_cl.lengths);
            free(puVar23);
            free(frequencies);
            free(frequencies_00);
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            free(bitlen_lld_e.data);
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld.size._0_4_ = 0;
            bitlen_lld.size._4_4_ = 0;
            bitlen_lld.allocsize = 0;
            free(bitlen_lld.data);
            bitlen_lld.data = (uint *)0x0;
            local_a8.size = 0;
            local_a8.allocsize = 0;
            free(local_a8.data);
          }
          else if (settings->btype == 1) {
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            generateFixedLitLenTree(&tree_ll);
            generateFixedDistanceTree(&tree_d);
            sVar29 = bp;
            sVar27 = v.size;
            if ((bp & 7) == 0) {
              uVar39 = v.size + 1;
              puVar22 = v.data;
              uVar34 = v.allocsize;
              if (v.allocsize < uVar39) {
                uVar34 = uVar39 * 3 >> 1;
                if (v.allocsize * 2 < uVar39) {
                  uVar34 = uVar39;
                }
                puVar22 = (uchar *)realloc(v.data,uVar34);
                if (puVar22 == (uchar *)0x0) goto LAB_0010d712;
              }
              v.allocsize = uVar34;
              v.data = puVar22;
              v.data[sVar27] = '\0';
              v.size = uVar39;
            }
LAB_0010d712:
            sVar27 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | bVar43 << ((byte)sVar29 & 7);
            bp = sVar29 + 1;
            bVar31 = (byte)bp;
            if ((bp & 7) == 0) {
              uVar39 = v.size + 1;
              puVar22 = v.data;
              uVar34 = v.allocsize;
              if (v.allocsize < uVar39) {
                uVar34 = uVar39 * 3 >> 1;
                if (v.allocsize * 2 < uVar39) {
                  uVar34 = uVar39;
                }
                puVar22 = (uchar *)realloc(v.data,uVar34);
                if (puVar22 == (uchar *)0x0) goto LAB_0010d79b;
              }
              v.allocsize = uVar34;
              v.data = puVar22;
              v.data[sVar27] = '\0';
              v.size = uVar39;
            }
LAB_0010d79b:
            sVar27 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << (bVar31 & 7);
            bp = sVar29 + 2;
            if ((bp & 7) == 0) {
              uVar39 = v.size + 1;
              puVar22 = v.data;
              uVar34 = v.allocsize;
              if (v.allocsize < uVar39) {
                uVar34 = uVar39 * 3 >> 1;
                if (v.allocsize * 2 < uVar39) {
                  uVar34 = uVar39;
                }
                puVar22 = (uchar *)realloc(v.data,uVar34);
                if (puVar22 == (uchar *)0x0) goto LAB_0010d819;
              }
              v.allocsize = uVar34;
              v.data = puVar22;
              v.data[sVar27] = '\0';
              v.size = uVar39;
            }
LAB_0010d819:
            puVar23 = tree_ll.lengths;
            bp = sVar29 + 3;
            if (settings->use_lz77 == 0) {
              uVar14 = 0;
              if (uVar40 < uVar32) {
                puVar11 = tree_ll.tree1d;
                lVar41 = 0;
                do {
                  addHuffmanSymbol(&bp,&v,puVar11[puVar21[lVar41]],puVar23[puVar21[lVar41]]);
                  lVar41 = lVar41 + 1;
                } while (uVar25 + lVar37 != lVar41);
                uVar14 = 0;
              }
            }
            else {
              tree_cl.tree2d = (uint *)0x0;
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              uVar14 = encodeLZ77((uivector *)&tree_cl,&local_68,in,uVar40,uVar32,
                                  settings->windowsize,settings->minmatch,settings->nicematch,
                                  settings->lazymatching);
              if (uVar14 == 0) {
                writeLZ77data(&bp,&v,(uivector *)&tree_cl,&tree_ll,&tree_d);
              }
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              free(tree_cl.tree2d);
            }
            if (uVar14 == 0) {
              addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
            }
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
          }
          uVar38 = uVar38 + 1;
          if (uVar38 == uVar26) break;
          uVar35 = uVar35 + sVar36;
          lVar37 = lVar37 - sVar36;
          puVar21 = puVar21 + sVar36;
        } while (uVar14 == 0);
      }
      free(local_68.head);
      free(local_68.val);
      free(local_68.chain);
      free(local_68.zeros);
      free(local_68.headz);
      free(local_68.chainz);
    }
  }
LAB_0010e609:
  *out = v.data;
  *outsize = v.size;
  return uVar14;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
	const unsigned char* in, size_t insize,
	const LodePNGCompressSettings* settings)
{
	unsigned error;
	ucvector v;
	ucvector_init_buffer(&v, *out, *outsize);
	error = lodepng_deflatev(&v, in, insize, settings);
	*out = v.data;
	*outsize = v.size;
	return error;
}